

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_193bfa::LocalFileSystem::createDirectory(LocalFileSystem *this,string *path)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  undefined1 local_b0 [8];
  StatStruct statbuf;
  string *path_local;
  LocalFileSystem *this_local;
  
  statbuf.__glibc_reserved[2] = (__syscall_slong_t)path;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  uVar1 = llbuild::basic::sys::mkdir(pcVar3,(__mode_t)path);
  if ((uVar1 & 1) == 0) {
    piVar4 = __errno_location();
    if (*piVar4 != 0x11) {
      return false;
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = llbuild::basic::sys::lstat(pcVar3,(stat *)local_b0);
    if (iVar2 != 0) {
      return false;
    }
    if (((uint)statbuf.st_nlink & 0xf000) != 0x4000) {
      return false;
    }
  }
  return true;
}

Assistant:

virtual bool
  createDirectory(const std::string& path) override {
    if (!llbuild::basic::sys::mkdir(path.c_str())) {
      if (errno != EEXIST) {
        return false;
      }

      // Target exists, check that it is actually a directory
      llbuild::basic::sys::StatStruct statbuf;
      if (llbuild::basic::sys::lstat(path.c_str(), &statbuf) != 0) {
        return false;
      }
      if (!S_ISDIR(statbuf.st_mode)) {
        return false;
      }
    }
    return true;
  }